

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Generators<arg_res_tuple<long_double,_1UL>_> *
Catch::Generators::
makeGenerators<arg_res_tuple<long_double,1ul>,arg_res_tuple<long_double,1ul>,arg_res_tuple<long_double,1ul>,arg_res_tuple<long_double,1ul>>
          (arg_res_tuple<long_double,_1UL> *val,arg_res_tuple<long_double,_1UL> *moreGenerators,
          arg_res_tuple<long_double,_1UL> *moreGenerators_1,
          arg_res_tuple<long_double,_1UL> *moreGenerators_2)

{
  arg_res_tuple<long_double,_1UL> *in_RDX;
  Generators<arg_res_tuple<long_double,_1UL>_> *in_RDI;
  Generators<arg_res_tuple<long_double,_1UL>_> *moreGenerators_2_00;
  arg_res_tuple<long_double,_1UL> *moreGenerators_1_00;
  arg_res_tuple<long_double,_1UL> *in_stack_ffffffffffffffc0;
  GeneratorWrapper<arg_res_tuple<long_double,_1UL>_> *in_stack_ffffffffffffffc8;
  
  moreGenerators_1_00 = (arg_res_tuple<long_double,_1UL> *)&stack0xffffffffffffffd0;
  moreGenerators_2_00 = in_RDI;
  value<arg_res_tuple<long_double,1ul>>(in_RDX);
  makeGenerators<arg_res_tuple<long_double,1ul>,arg_res_tuple<long_double,1ul>,arg_res_tuple<long_double,1ul>,arg_res_tuple<long_double,1ul>>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,moreGenerators_1_00,
             (arg_res_tuple<long_double,_1UL> *)moreGenerators_2_00);
  GeneratorWrapper<arg_res_tuple<long_double,_1UL>_>::~GeneratorWrapper
            ((GeneratorWrapper<arg_res_tuple<long_double,_1UL>_> *)0x3e5e07);
  return in_RDI;
}

Assistant:

auto makeGenerators( T&& val, Gs &&... moreGenerators ) -> Generators<T> {
        return makeGenerators( value( std::forward<T>( val ) ), std::forward<Gs>( moreGenerators )... );
    }